

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>
std::_V2::__rotate<QJsonPrivate::ObjectIterator<QtCbor::Element,QList<QtCbor::Element>::iterator>>
          (iterator __first,
          ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator> __middle,Element *__last
          )

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  long lVar5;
  long lVar6;
  iterator iVar7;
  reference b;
  bool bVar8;
  
  iVar7.i = __last;
  if (((iterator)__first.i != __middle.it.i) &&
     (lVar6 = (long)__last - (long)__middle.it.i, iVar7.i = __first.i, lVar6 != 0)) {
    auVar1._8_8_ = (long)__last - (long)__first.i >> 0x3f;
    auVar1._0_8_ = (long)__last - (long)__first.i >> 4;
    lVar4 = SUB168(auVar1 / SEXT816(2),0);
    auVar2._8_8_ = (long)__middle.it.i - (long)__first.i >> 0x3f;
    auVar2._0_8_ = (long)__middle.it.i - (long)__first.i >> 4;
    lVar5 = SUB168(auVar2 / SEXT816(2),0);
    if (lVar4 == lVar5 * 2) {
      swap_ranges<QJsonPrivate::ObjectIterator<QtCbor::Element,QList<QtCbor::Element>::iterator>,QJsonPrivate::ObjectIterator<QtCbor::Element,QList<QtCbor::Element>::iterator>>
                ((ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>)__first.i,
                 __middle,__middle);
      iVar7 = __middle.it.i;
    }
    else {
      auVar3._8_8_ = lVar6 >> 0x3f;
      auVar3._0_8_ = lVar6 >> 4;
      iVar7.i = __first.i + SUB168(auVar3 / SEXT816(2),0) * 2;
      do {
        for (; lVar6 = lVar4 - lVar5, lVar5 < lVar6; lVar5 = lVar5 - lVar6) {
          if (lVar6 < 1) {
            lVar6 = 0;
          }
          while (bVar8 = lVar6 != 0, lVar6 = lVar6 + -1, bVar8) {
            QJsonPrivate::swap((reference)__first.i,__first.i + lVar5 * 2);
            __first.i = __first.i + 2;
          }
          lVar6 = lVar4 % lVar5;
          if (lVar6 == 0) {
            return (ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>)
                   (iterator)iVar7.i;
          }
          lVar4 = lVar5;
        }
        b.m_key = __first.i + lVar4 * 2 + -2;
        __first.i = __first.i + lVar4 * 2 + lVar6 * -2;
        if (lVar5 < 1) {
          lVar5 = 0;
        }
        while (bVar8 = lVar5 != 0, lVar5 = lVar5 + -1, bVar8) {
          __first.i = __first.i + -2;
          QJsonPrivate::swap((reference)__first.i,b);
          b.m_key = b.m_key + -2;
        }
        lVar5 = lVar4 % lVar6;
        lVar4 = lVar6;
      } while (lVar5 != 0);
    }
  }
  return (ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>)(iterator)iVar7.i;
}

Assistant:

inline constexpr bool operator==(iterator o) const { return i == o.i; }